

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)

{
  ZSTD_compressionParameters cParams_00;
  size_t sVar1;
  size_t sVar2;
  undefined8 in_stack_00000008;
  undefined4 in_stack_00000010;
  undefined4 in_stack_00000014;
  undefined4 in_stack_00000018;
  undefined4 in_stack_0000001c;
  int in_stack_00000020;
  ZSTD_CCtx_params initialParams;
  ZSTD_CCtx_params local_e0;
  
  cParams_00.strategy = in_stack_00000020;
  cParams_00.targetLength = in_stack_0000001c;
  cParams_00.hashLog = in_stack_00000010;
  cParams_00._0_8_ = in_stack_00000008;
  cParams_00.searchLog = in_stack_00000014;
  cParams_00.minMatch = in_stack_00000018;
  ZSTD_makeCCtxParamsFromCParams(cParams_00);
  if (in_stack_00000020 - 6U < 0xfffffffd) {
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams(&local_e0);
  }
  else {
    local_e0.useRowMatchFinder = ZSTD_ps_disable;
    sVar2 = ZSTD_estimateCCtxSize_usingCCtxParams(&local_e0);
    local_e0.useRowMatchFinder = ZSTD_ps_enable;
    sVar1 = ZSTD_estimateCCtxSize_usingCCtxParams(&local_e0);
    if (sVar1 < sVar2) {
      sVar1 = sVar2;
    }
  }
  return sVar1;
}

Assistant:

size_t ZSTD_estimateCCtxSize_usingCParams(ZSTD_compressionParameters cParams)
{
    ZSTD_CCtx_params initialParams = ZSTD_makeCCtxParamsFromCParams(cParams);
    if (ZSTD_rowMatchFinderSupported(cParams.strategy)) {
        /* Pick bigger of not using and using row-based matchfinder for greedy and lazy strategies */
        size_t noRowCCtxSize;
        size_t rowCCtxSize;
        initialParams.useRowMatchFinder = ZSTD_ps_disable;
        noRowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        initialParams.useRowMatchFinder = ZSTD_ps_enable;
        rowCCtxSize = ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
        return MAX(noRowCCtxSize, rowCCtxSize);
    } else {
        return ZSTD_estimateCCtxSize_usingCCtxParams(&initialParams);
    }
}